

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSObjectFactory::processAttUse
          (XSObjectFactory *this,SchemaAttDef *attDef,XSAttributeUse *xsAttUse)

{
  DefAttTypes DVar1;
  VALUE_CONSTRAINT constraintType;
  bool isRequired;
  
  DVar1 = (attDef->super_XMLAttDef).fDefaultType;
  constraintType = VALUE_CONSTRAINT_NONE;
  if (DVar1 == DefAttTypes_Min) {
    constraintType = VALUE_CONSTRAINT_DEFAULT;
    isRequired = false;
  }
  else {
    if ((DVar1 == Required_And_Fixed) || (DVar1 == Fixed)) {
      constraintType = VALUE_CONSTRAINT_FIXED;
    }
    isRequired = (DVar1 & ~Fixed) == Required;
  }
  XSAttributeUse::set(xsAttUse,isRequired,constraintType,(attDef->super_XMLAttDef).fValue);
  return;
}

Assistant:

void XSObjectFactory::processAttUse(SchemaAttDef* const attDef,
                                    XSAttributeUse* const xsAttUse)
{
    bool isRequired = false;
    XSConstants::VALUE_CONSTRAINT constraintType = XSConstants::VALUE_CONSTRAINT_NONE;

    if (attDef->getDefaultType() == XMLAttDef::Default)
    {
        constraintType = XSConstants::VALUE_CONSTRAINT_DEFAULT;
    }
    else if ((attDef->getDefaultType() == XMLAttDef::Fixed) ||
             (attDef->getDefaultType() == XMLAttDef::Required_And_Fixed))
    {
        constraintType = XSConstants::VALUE_CONSTRAINT_FIXED;
    }

    if (attDef->getDefaultType() == XMLAttDef::Required ||
        attDef->getDefaultType() == XMLAttDef::Required_And_Fixed)
        isRequired = true;

    xsAttUse->set(isRequired, constraintType, attDef->getValue());
}